

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<4>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<4> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  PointIndex *pPVar1;
  int *piVar2;
  uint uVar3;
  uint32_t *puVar4;
  pointer puVar5;
  pointer puVar6;
  uint *puVar7;
  pointer pvVar8;
  PointAttributeVectorOutputIterator<unsigned_int> *pPVar9;
  bool bVar10;
  byte bVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  _Elt_pointer pDVar14;
  ulong uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint uVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar19;
  int nbits;
  VectorUint32 *levels;
  RAnsBitDecoder *this_00;
  uint32_t uVar20;
  ulong uVar21;
  bool bVar22;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>_>
  status_stack;
  bool local_ed;
  uint local_ec;
  DecodingStatus local_e8;
  uint32_t local_dc;
  long local_d8;
  DecodingStatus local_cc;
  ulong local_c0;
  ulong local_b8;
  PointAttributeVectorOutputIterator<unsigned_int> *local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  local_a8;
  ulong local_50;
  RAnsBitDecoder *local_48;
  VectorUint32 *local_40;
  DirectBitDecoder *local_38;
  
  local_cc.num_remaining_points = 0;
  local_dc = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_cc.num_remaining_points,(allocator_type *)&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_a8);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_cc.num_remaining_points,(allocator_type *)&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.num_remaining_points = local_dc;
  local_cc.last_axis = 0;
  local_cc.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
                *)&local_a8,&local_cc);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_cc.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_cc.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_cc.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_ed = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (!local_ed) {
    local_48 = (RAnsBitDecoder *)&this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    local_40 = &this->p_;
    local_b0 = oit;
    do {
      pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
      }
      uVar20 = pDVar14[-1].num_remaining_points;
      uVar12 = pDVar14[-1].last_axis;
      uVar3 = pDVar14[-1].stack_pos;
      uVar21 = (ulong)uVar3;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_ec = 1;
      if (uVar20 <= local_dc) {
        pvVar19 = (this->base_stack_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar21;
        levels = (this->levels_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar21;
        uVar12 = GetAxis(this,uVar20,levels,uVar12);
        pPVar9 = local_b0;
        if (uVar12 < this->dimension_) {
          local_b8 = (ulong)uVar12;
          uVar16 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start[local_b8];
          local_c0 = uVar21;
          if (this->bit_length_ == uVar16) {
            if (uVar20 == 0) {
              local_ec = 0;
            }
            else {
              local_ec = 0;
              do {
                PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar9,pvVar19);
                pPVar1 = &pPVar9->point_id_;
                pPVar1->value_ = pPVar1->value_ + 1;
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
          }
          else if (uVar20 < 3) {
            puVar4 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            *puVar4 = uVar12;
            uVar21 = (ulong)this->dimension_;
            if (1 < this->dimension_) {
              uVar12 = *puVar4;
              uVar15 = 1;
              do {
                bVar22 = uVar12 == (int)uVar21 - 1U;
                uVar12 = uVar12 + 1;
                if (bVar22) {
                  uVar12 = 0;
                }
                puVar4[uVar15] = uVar12;
                uVar15 = uVar15 + 1;
                uVar21 = (ulong)this->dimension_;
              } while (uVar15 < uVar21);
            }
            if (uVar20 != 0) {
              uVar12 = 0;
              do {
                bVar22 = this->dimension_ != 0;
                local_ec = 0xd;
                if (bVar22) {
                  uVar21 = 0;
                  do {
                    puVar5 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar6 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar5[puVar6[uVar21]] = 0;
                    uVar3 = puVar6[uVar21];
                    nbits = this->bit_length_ -
                            (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar3];
                    if ((nbits != 0) &&
                       (bVar10 = DirectBitDecoder::DecodeLeastSignificantBits32
                                           (local_38,nbits,puVar5 + uVar3), !bVar10)) {
                      local_ec = 1;
                      goto LAB_0015baeb;
                    }
                    uVar3 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar21];
                    puVar7 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + uVar3;
                    *puVar7 = *puVar7 | (pvVar19->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar3];
                    uVar21 = uVar21 + 1;
                    bVar22 = uVar21 < this->dimension_;
                  } while (bVar22);
                  local_ec = 0xd;
                }
LAB_0015baeb:
                pPVar9 = local_b0;
                if (bVar22) goto LAB_0015bb1d;
                PointAttributeVectorOutputIterator<unsigned_int>::operator=(local_b0,local_40);
                (pPVar9->point_id_).value_ = (pPVar9->point_id_).value_ + 1;
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar20);
            }
            local_ec = 10;
LAB_0015bb1d:
            if (local_ec == 10) {
              local_ec = 0;
            }
          }
          else if (this->num_decoded_points_ <= this->num_points_) {
            local_d8 = CONCAT44(local_d8._4_4_,this->bit_length_);
            uVar21 = (ulong)(uVar3 + 1);
            local_50 = uVar21;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar21,pvVar19);
            piVar2 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_b8 * 4);
            *piVar2 = *piVar2 + (1 << ((char)local_d8 + ~(byte)uVar16 & 0x1f));
            uVar3 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            uVar18 = 0;
            local_d8 = uVar21 * 3;
            if (uVar3 != 0) {
              uVar15 = (ulong)uVar3;
              uVar18 = 0;
              this_00 = local_48;
              do {
                bVar22 = RAnsBitDecoder::DecodeNextBit(this_00);
                uVar18 = (uint)bVar22 + uVar18 * 2;
                this_00 = this_00 + 1;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
            uVar16 = (uVar20 >> 1) - uVar18;
            if (uVar18 <= uVar20 >> 1) {
              uVar20 = uVar20 - uVar16;
              uVar17 = uVar16;
              if (uVar16 != uVar20) {
                puVar7 = (this->half_decoder_).pos_._M_current;
                if (puVar7 == (this->half_decoder_).bits_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  bVar11 = 0;
                }
                else {
                  uVar13 = (this->half_decoder_).num_used_bits_;
                  bVar11 = (byte)((*puVar7 << ((byte)uVar13 & 0x1f)) >> 0x1f);
                  uVar13 = uVar13 + 1;
                  (this->half_decoder_).num_used_bits_ = uVar13;
                  if (uVar13 == 0x20) {
                    (this->half_decoder_).pos_._M_current = puVar7 + 1;
                    (this->half_decoder_).num_used_bits_ = 0;
                  }
                }
                if (bVar11 == 0) {
                  uVar17 = uVar20;
                  uVar20 = uVar16;
                }
              }
              pvVar8 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar19 = pvVar8 + local_c0;
              puVar5 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_b8;
              *puVar5 = *puVar5 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar8->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_d8 * 8),pvVar19);
              if (uVar17 != 0) {
                local_e8.stack_pos = (uint32_t)local_c0;
                local_e8.num_remaining_points = uVar17;
                local_e8.last_axis = uVar12;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              local_ec = 0;
              if (uVar20 != 0) {
                local_e8.stack_pos = (uint32_t)local_50;
                local_e8.num_remaining_points = uVar20;
                local_e8.last_axis = uVar12;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
            }
          }
        }
      }
    } while (((local_ec & 0xd) == 0) &&
            (local_ed = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur, !local_ed));
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return local_ed;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}